

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O3

rk_s32 kmpp_obj_udump_f(KmppObj obj,char *caller)

{
  MppTrieInfo *__haystack;
  byte bVar1;
  ushort uVar2;
  MppTrie trie;
  ushort uVar3;
  void *__s2;
  rk_s32 rVar4;
  int iVar5;
  int iVar6;
  MppTrieInfo *info;
  MppTrieInfo *pMVar7;
  char *pcVar8;
  undefined8 *val_00;
  undefined8 *val_01;
  void *val_02;
  uint uVar9;
  ulong uVar11;
  KmppEntry *tbl;
  ulong local_110;
  rk_s32 val_chk;
  undefined4 uStack_f4;
  rk_s32 local_f0;
  uint local_ec;
  KmppObj local_e8;
  void *local_e0;
  ulong local_d8;
  KmppEntry *local_d0;
  long local_c8;
  MppTrie local_c0;
  rk_s32 val;
  undefined4 uStack_b4;
  ulong uVar10;
  
  if ((obj == (KmppObj)0x0) || (*(long *)((long)obj + 8) == 0)) {
    _mpp_log_l(2,"kmpp_obj","invalid obj %p def %p\n","kmpp_obj_udump_f",obj,0);
  }
  else {
    trie = *(MppTrie *)((long)obj + 0x10);
    _mpp_log_l(4,"kmpp_obj","dump obj %-12s - %p at %s:\n",(char *)0x0,
               *(undefined8 *)(*(long *)((long)obj + 8) + 0x18),obj,caller);
    local_c0 = trie;
    info = mpp_trie_get_info_first(trie);
    if (info != (MppTrieInfo *)0x0) {
      rVar4 = -1;
      local_110 = 0;
      local_e8 = obj;
      do {
        pMVar7 = mpp_trie_get_info_next(local_c0,info);
        __haystack = info + 1;
        bVar1 = info->field_0x3;
        pcVar8 = strstr((char *)__haystack,"__");
        uVar10 = local_110;
        if (pcVar8 == (char *)0x0) {
          tbl = (KmppEntry *)(&info[1].field_0x0 + bVar1);
          uVar9 = (int)local_110 + 1;
          uVar10 = (ulong)uVar9;
          switch((ulong)(*(ushort *)tbl >> 8)) {
          case 0:
            rVar4 = kmpp_obj_tbl_get_s32(obj,tbl,&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s32 %#x:%d\n",(char *)0x0,local_110,__haystack,
                         (ulong)(uint)val,(ulong)(uint)val);
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s32 get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_s32(obj,(char *)__haystack,&val_chk);
            if (val != val_chk) {
              pcVar8 = "%-2d - %-16s s32 check failed\n";
LAB_00168455:
              _mpp_log_l(2,"kmpp_obj",pcVar8,(char *)0x0,local_110,__haystack);
            }
            break;
          case 1:
            rVar4 = kmpp_obj_tbl_get_u32(obj,tbl,(rk_u32 *)&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u32 %#x:%u\n",(char *)0x0,local_110,__haystack,
                         (ulong)(uint)val,(ulong)(uint)val);
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u32 get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_u32(obj,(char *)__haystack,(rk_u32 *)&val_chk);
            if (val != val_chk) {
              pcVar8 = "%-2d - %-16s u32 check failed\n";
              goto LAB_00168455;
            }
            break;
          case 2:
            rVar4 = kmpp_obj_tbl_get_s64(obj,tbl,(rk_s64 *)&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s64 %#llx:%lld\n",(char *)0x0,local_110,
                         __haystack,CONCAT44(uStack_b4,val),CONCAT44(uStack_b4,val));
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s64 get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_s64(obj,(char *)__haystack,(rk_s64 *)&val_chk);
            if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_f4,val_chk)) {
              pcVar8 = "%-2d - %-16s s64 check failed\n";
              goto LAB_00168455;
            }
            break;
          case 3:
            rVar4 = kmpp_obj_tbl_get_u64(obj,tbl,(rk_u64 *)&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u64 %#llx:%llu\n",(char *)0x0,local_110,
                         __haystack,CONCAT44(uStack_b4,val),CONCAT44(uStack_b4,val));
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u64 get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_u64(obj,(char *)__haystack,(rk_u64 *)&val_chk);
            if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_f4,val_chk)) {
              pcVar8 = "%-2d - %-16s u64 check failed\n";
              goto LAB_00168455;
            }
            break;
          default:
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s found invalid type %d\n",(char *)0x0,local_110,
                       __haystack,(ulong)(*(ushort *)tbl >> 8));
            rVar4 = -1;
            break;
          case 5:
            local_ec = uVar9;
            local_e0 = mpp_osal_malloc("kmpp_obj_udump_f",
                                       (ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
            val_02 = mpp_osal_malloc("kmpp_obj_udump_f",
                                     (ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
            uVar2 = *(ushort *)(&info[1].field_0x2 + bVar1);
            rVar4 = kmpp_obj_tbl_get_st(obj,tbl,val_02);
            local_d0 = tbl;
            if (rVar4 == 0) {
              uVar11 = 0;
              local_f0 = rVar4;
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s st  %d:%d\n",(char *)0x0,local_110,__haystack,
                         (ulong)*(ushort *)(&info[2].field_0x0 + bVar1),(ulong)uVar2);
              uVar3 = uVar2 >> 2;
              uVar10 = (ulong)uVar3;
              if (0x23 < uVar2) {
                local_c8 = (long)(int)(uVar3 - 8);
                uVar11 = 0;
                local_d8 = (ulong)uVar3;
                do {
                  snprintf((char *)&val,0x7f,
                           "   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x",
                           uVar11 & 0xffffffff,(ulong)*(uint *)((long)val_02 + uVar11 * 4),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 4),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 8),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 0xc),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 0x10),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 0x14),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 0x18),
                           (ulong)*(uint *)((long)val_02 + uVar11 * 4 + 0x1c));
                  _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&val);
                  uVar11 = uVar11 + 8;
                  uVar10 = local_d8;
                  obj = local_e8;
                } while ((long)uVar11 < local_c8);
              }
              iVar5 = snprintf((char *)&val,0x7f,"   - %02x :");
              if ((uint)uVar11 < (uint)uVar10) {
                uVar11 = uVar11 & 0xffffffff;
                do {
                  iVar6 = snprintf((char *)((long)&val + (long)iVar5),0x7f - (long)iVar5," %#08x");
                  iVar5 = iVar5 + iVar6;
                  uVar11 = uVar11 + 1;
                } while (uVar10 != uVar11);
              }
              _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&val);
              rVar4 = local_f0;
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            __s2 = local_e0;
            kmpp_obj_get_st(obj,(char *)__haystack,local_e0);
            iVar5 = bcmp(val_02,__s2,(ulong)*(ushort *)((long)local_d0 + 2));
            uVar10 = (ulong)local_ec;
            if (iVar5 != 0) {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  check failed\n",(char *)0x0,local_110,
                         __haystack);
              _mpp_log_l(2,"kmpp_obj","val     %p\n",(char *)0x0,val_02);
              _mpp_log_l(2,"kmpp_obj","val_chk %p\n",(char *)0x0,__s2);
            }
            if (val_02 != (void *)0x0) {
              mpp_osal_free("kmpp_obj_udump_f",val_02);
            }
            obj = local_e8;
            if (local_e0 != (void *)0x0) {
              mpp_osal_free("kmpp_obj_udump_f",local_e0);
            }
            break;
          case 6:
            local_ec = uVar9;
            val_00 = (undefined8 *)
                     mpp_osal_malloc("kmpp_obj_udump_f",
                                     (ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
            val_01 = (undefined8 *)
                     mpp_osal_malloc("kmpp_obj_udump_f",
                                     (ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
            local_f0 = kmpp_obj_tbl_get_st(obj,tbl,val_01);
            if (local_f0 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s shm u%#llx:k%#llx\n",(char *)0x0,local_110,
                         __haystack,*val_01,val_01[1]);
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_st(obj,(char *)__haystack,val_00);
            iVar5 = bcmp(val_01,val_00,(ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
            if (iVar5 == 0) {
              if (val_01 != (undefined8 *)0x0) goto LAB_0016816a;
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm check failed\n",(char *)0x0,local_110,
                         __haystack);
              _mpp_log_l(2,"kmpp_obj","val     %p - %#llx:%#llx\n",(char *)0x0,val_01,*val_01,
                         val_01[1]);
              _mpp_log_l(2,"kmpp_obj","val_chk %p - %#llx:%#llx\n",(char *)0x0,val_00,*val_00,
                         val_00[1]);
LAB_0016816a:
              mpp_osal_free("kmpp_obj_udump_f",val_01);
            }
            if (val_00 != (undefined8 *)0x0) {
              mpp_osal_free("kmpp_obj_udump_f",val_00);
            }
            uVar10 = (ulong)local_ec;
            rVar4 = local_f0;
            break;
          case 0xd:
            rVar4 = kmpp_obj_tbl_get_ptr(obj,tbl,(void **)&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s ptr %p\n",(char *)0x0,local_110,__haystack,
                         CONCAT44(uStack_b4,val));
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s ptr get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_ptr(obj,(char *)__haystack,(void **)&val_chk);
            if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_f4,val_chk)) {
              pcVar8 = "%-2d - %-16s ptr check failed\n";
              goto LAB_00168455;
            }
            break;
          case 0xe:
            rVar4 = kmpp_obj_tbl_get_fp(obj,tbl,(void **)&val);
            if (rVar4 == 0) {
              _mpp_log_l(4,"kmpp_obj","%-2d - %-16s fp  %p\n",(char *)0x0,local_110,__haystack,
                         CONCAT44(uStack_b4,val));
            }
            else {
              _mpp_log_l(2,"kmpp_obj","%-2d - %-16s fp  get failed\n",(char *)0x0,local_110,
                         __haystack);
            }
            kmpp_obj_get_fp(obj,(char *)__haystack,(void **)&val_chk);
            if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_f4,val_chk)) {
              pcVar8 = "%-2d - %-16s fp  check failed\n";
              goto LAB_00168455;
            }
          }
        }
        info = pMVar7;
        local_110 = uVar10;
        if (pMVar7 == (MppTrieInfo *)0x0) {
          return -(uint)(rVar4 != 0);
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

rk_s32 kmpp_obj_udump_f(KmppObj obj, const char *caller)
{
    KmppObjImpl *impl = (KmppObjImpl *)obj;
    KmppObjDefImpl *def = impl ? impl->def : NULL;
    MppTrie trie = NULL;
    MppTrieInfo *info = NULL;
    MppTrieInfo *next = NULL;
    const char *name = NULL;
    rk_s32 ret = rk_nok;
    RK_S32 i = 0;

    if (!impl || !def) {
        mpp_loge_f("invalid obj %p def %p\n", impl, def);
        return rk_nok;
    }

    trie = impl->trie;
    name = def->name;

    mpp_logi("dump obj %-12s - %p at %s:\n", name, impl, caller);

    next = mpp_trie_get_info_first(trie);
    while (next) {
        KmppEntry *e;
        rk_s32 idx;

        info = next;
        next = mpp_trie_get_info_next(trie, info);

        e = (KmppEntry *)mpp_trie_info_ctx(info);
        name = mpp_trie_info_name(info);

        if (strstr(name, "__"))
            continue;

        idx = i++;

        switch (e->tbl.elem_type) {
        case ELEM_TYPE_s32 : {
            rk_s32 val;
            rk_s32 val_chk;

            ret = kmpp_obj_tbl_get_s32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s32 %#x:%d\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s32 get failed\n", idx, name);

            kmpp_obj_get_s32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u32 : {
            rk_u32 val;
            rk_u32 val_chk;

            ret = kmpp_obj_tbl_get_u32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u32 %#x:%u\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u32 get failed\n", idx, name);

            kmpp_obj_get_u32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_s64 : {
            rk_s64 val;
            rk_s64 val_chk;

            ret = kmpp_obj_tbl_get_s64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s64 %#llx:%lld\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s64 get failed\n", idx, name);

            kmpp_obj_get_s64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u64 : {
            rk_u64 val;
            rk_u64 val_chk;

            ret = kmpp_obj_tbl_get_u64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u64 %#llx:%llu\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u64 get failed\n", idx, name);

            kmpp_obj_get_u64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_st : {
            void *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            void *val = mpp_malloc_size(void, e->tbl.elem_size);
            rk_s32 data_size = e->tbl.elem_size;
            char logs[128];

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret) {
                rk_s32 pos;
                rk_s32 j;

                mpp_logi("%-2d - %-16s st  %d:%d\n", idx, name, e->tbl.elem_offset, data_size);

                j = 0;
                for (; j < data_size / 4 - 8; j += 8) {
                    snprintf(logs, sizeof(logs) - 1, "   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x", j,
                             ((RK_U32 *)val)[j + 0], ((RK_U32 *)val)[j + 1],
                             ((RK_U32 *)val)[j + 2], ((RK_U32 *)val)[j + 3],
                             ((RK_U32 *)val)[j + 4], ((RK_U32 *)val)[j + 5],
                             ((RK_U32 *)val)[j + 6], ((RK_U32 *)val)[j + 7]);

                    mpp_logi("%s\n", logs);
                }

                pos = snprintf(logs, sizeof(logs) - 1, "   - %02x :", j);
                for (; j < data_size / 4; j++)
                    pos += snprintf(logs + pos, sizeof(logs) - 1 - pos, " %#08x", ((RK_U32 *)val)[j]);

                mpp_logi("%s\n", logs);
            } else
                mpp_loge("%-2d - %-16s st  get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s st  check failed\n", idx, name);
                mpp_loge("val     %p\n", val);
                mpp_loge("val_chk %p\n", val_chk);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_shm : {
            KmppShmPtr *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            KmppShmPtr *val = mpp_malloc_size(void, e->tbl.elem_size);

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret)
                mpp_logi("%-2d - %-16s shm u%#llx:k%#llx\n",
                         idx, name, val->uaddr, val->kaddr);
            else
                mpp_loge("%-2d - %-16s shm get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s shm check failed\n", idx, name);
                mpp_loge("val     %p - %#llx:%#llx\n", val, val->uaddr, val->kaddr);
                mpp_loge("val_chk %p - %#llx:%#llx\n", val_chk, val_chk->uaddr, val_chk->kaddr);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_uptr : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_ptr(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s ptr %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s ptr get failed\n", idx, name);

            kmpp_obj_get_ptr(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s ptr check failed\n", idx, name);
        } break;
        case ELEM_TYPE_ufp : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_fp(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s fp  %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s fp  get failed\n", idx, name);

            kmpp_obj_get_fp(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s fp  check failed\n", idx, name);
        } break;
        default : {
            mpp_loge("%-2d - %-16s found invalid type %d\n", idx, name, e->tbl.elem_type);
            ret = rk_nok;
        } break;
        }
    }

    return ret ? rk_nok : rk_ok;
}